

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O3

string * anon_unknown.dwarf_38441::getJSONForURI(string *__return_storage_ptr__,string *uri)

{
  int iVar1;
  string *extraout_RAX;
  string local_30;
  
  getJSONForURI_impl(&local_30,uri);
  iVar1 = std::__cxx11::string::compare((char *)&local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (iVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    local_30._M_string_length = (size_type)&local_30.field_2;
    if (local_30._M_dataplus._M_p != (pointer)local_30._M_string_length) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      local_30._M_string_length = (size_type)extraout_RAX;
    }
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_30.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_30.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_30._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_30.field_2._M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = local_30._M_string_length;
  }
  return (string *)local_30._M_string_length;
}

Assistant:

std::string getJSONForURI(const std::string & uri) {
        auto responseString = getJSONForURI_impl(uri);
        if (responseString == "") return "";

        return responseString;
    }